

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O0

bool cmTryRunCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  WorkingMode WVar2;
  size_type sVar3;
  cmake *this;
  undefined1 local_120 [8];
  TryRunCommandImpl tr;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmMakefile *local_28;
  cmMakefile *mf;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  mf = (cmMakefile *)status;
  status_local = (cmExecutionStatus *)args;
  local_28 = cmExecutionStatus::GetMakefile(status);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
  pcVar1 = local_28;
  if (sVar3 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"The try_run() command requires at least 4 arguments.",&local_49)
    ;
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    args_local._7_1_ = 0;
  }
  else {
    this = cmMakefile::GetCMakeInstance(local_28);
    WVar2 = cmake::GetWorkingMode(this);
    pcVar1 = local_28;
    if (WVar2 == FIND_PACKAGE_MODE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,
                 "The try_run() command is not supported in --find-package mode.",
                 (allocator<char> *)(tr.RunResultVariable.field_2._M_local_buf + 0xf));
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator
                ((allocator<char> *)(tr.RunResultVariable.field_2._M_local_buf + 0xf));
      args_local._7_1_ = 0;
    }
    else {
      anon_unknown.dwarf_62136d::TryRunCommandImpl::TryRunCommandImpl
                ((TryRunCommandImpl *)local_120,local_28);
      args_local._7_1_ =
           anon_unknown.dwarf_62136d::TryRunCommandImpl::TryRunCode
                     ((TryRunCommandImpl *)local_120,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
      anon_unknown.dwarf_62136d::TryRunCommandImpl::~TryRunCommandImpl
                ((TryRunCommandImpl *)local_120);
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmTryRunCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  cmMakefile& mf = status.GetMakefile();

  if (args.size() < 4) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "The try_run() command requires at least 4 arguments.");
    return false;
  }

  if (mf.GetCMakeInstance()->GetWorkingMode() == cmake::FIND_PACKAGE_MODE) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "The try_run() command is not supported in --find-package mode.");
    return false;
  }

  TryRunCommandImpl tr(&mf);
  return tr.TryRunCode(args);
}